

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

bool __thiscall QTextStreamPrivate::fillReadBuffer(QTextStreamPrivate *this,qint64 maxBytes)

{
  QString *a;
  long lVar1;
  bool bVar2;
  ssize_t sVar3;
  QChar *pQVar4;
  QChar *pQVar5;
  QChar *pQVar6;
  QChar *pQVar7;
  size_t in_RCX;
  long lVar8;
  void *__buf;
  ulong uVar9;
  long in_FS_OFFSET;
  EncodedData<QByteArrayView> local_4050;
  char buf [16384];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QIODevice::isTextModeEnabled(this->device);
  if (bVar2) {
    QIODevice::setTextModeEnabled(this->device,false);
  }
  memset(buf,0xaa,0x4000);
  __buf = (void *)0x4000;
  if (maxBytes < 0x4000) {
    __buf = (void *)maxBytes;
  }
  if (maxBytes == -1) {
    __buf = (void *)0x4000;
  }
  sVar3 = QIODevice::read(this->device,(int)buf,__buf,in_RCX);
  if (bVar2) {
    QIODevice::setTextModeEnabled(this->device,true);
  }
  if (0 < sVar3) {
    a = &this->readBuffer;
    uVar9 = (this->readBuffer).d.size;
    local_4050.decoder = &this->toUtf16;
    local_4050.data.m_size = sVar3;
    local_4050.data.m_data = buf;
    operator+=(a,&local_4050);
    if (bVar2 && uVar9 < (ulong)(this->readBuffer).d.size) {
      pQVar4 = QString::data(a);
      pQVar4 = pQVar4 + uVar9;
      pQVar5 = QString::data(a);
      pQVar7 = pQVar5 + uVar9;
      pQVar6 = QString::data(a);
      pQVar6 = pQVar6 + (this->readBuffer).d.size;
      if (pQVar7 < pQVar6) {
        pQVar5 = pQVar5 + uVar9 + 1;
        do {
          pQVar7 = pQVar5;
          if (pQVar7[-1].ucs == L'\r') break;
          uVar9 = uVar9 + 1;
          pQVar4 = pQVar4 + 1;
          pQVar5 = pQVar7 + 1;
        } while (pQVar4 != pQVar6);
      }
      lVar8 = this->readBufferOffset;
      for (; pQVar7 < pQVar6; pQVar7 = pQVar7 + 1) {
        if (pQVar7->ucs == L'\r') {
          if ((long)uVar9 < lVar8) {
            lVar8 = lVar8 + -1;
            this->readBufferOffset = lVar8;
          }
        }
        else {
          pQVar4->ucs = pQVar7->ucs;
          pQVar4 = pQVar4 + 1;
        }
        uVar9 = uVar9 + 1;
      }
      pQVar7 = QString::data(a);
      QString::resize(a,(long)pQVar4 - (long)pQVar7 >> 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0 < sVar3;
}

Assistant:

bool QTextStreamPrivate::fillReadBuffer(qint64 maxBytes)
{
    // no buffer next to the QString itself; this function should only
    // be called internally, for devices.
    Q_ASSERT(!string);
    Q_ASSERT(device);

    // handle text translation and bypass the Text flag in the device.
    bool textModeEnabled = device->isTextModeEnabled();
    if (textModeEnabled)
        device->setTextModeEnabled(false);

    // read raw data into a temporary buffer
    char buf[QTEXTSTREAM_BUFFERSIZE];
    qint64 bytesRead = 0;
#if defined(Q_OS_WIN)
    // On Windows, there is no non-blocking stdin - so we fall back to reading
    // lines instead. If there is no QOBJECT, we read lines for all sequential
    // devices; otherwise, we read lines only for stdin.
    QFile *file = 0;
    Q_UNUSED(file);
    if (device->isSequential()
#if !defined(QT_NO_QOBJECT)
        && (file = qobject_cast<QFile *>(device)) && file->handle() == 0
#endif
        ) {
        if (maxBytes != -1)
            bytesRead = device->readLine(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->readLine(buf, sizeof(buf));
    } else
#endif
    {
        if (maxBytes != -1)
            bytesRead = device->read(buf, qMin<qint64>(sizeof(buf), maxBytes));
        else
            bytesRead = device->read(buf, sizeof(buf));
    }

    // reset the Text flag.
    if (textModeEnabled)
        device->setTextModeEnabled(true);

    if (bytesRead <= 0)
        return false;

#ifndef QT_BOOTSTRAPPED
    if (autoDetectUnicode) {
        autoDetectUnicode = false;

        auto e = QStringConverter::encodingForData(QByteArrayView(buf, bytesRead));
        // QStringConverter::Locale implies unknown, so keep the current encoding
        if (e) {
            encoding = *e;
            toUtf16 = QStringDecoder(encoding);
            fromUtf16 = QStringEncoder(encoding);
        }
    }
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), using %s encoding", QStringConverter::nameForEncoding(encoding));
#endif
#endif

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer(), device->read(\"%s\", %d) == %d",
           QtDebugUtils::toPrintable(buf, bytesRead, 32).constData(),
           int(sizeof(buf)), int(bytesRead));
#endif

    qsizetype oldReadBufferSize = readBuffer.size();
    readBuffer += toUtf16(QByteArrayView(buf, bytesRead));

    // remove all '\r\n' in the string.
    if (readBuffer.size() > oldReadBufferSize && textModeEnabled) {
        QChar CR = u'\r';
        QChar *writePtr = readBuffer.data() + oldReadBufferSize;
        QChar *readPtr = readBuffer.data() + oldReadBufferSize;
        QChar *endPtr = readBuffer.data() + readBuffer.size();

        qsizetype n = oldReadBufferSize;
        if (readPtr < endPtr) {
            // Cut-off to avoid unnecessary self-copying.
            while (*readPtr++ != CR) {
                ++n;
                if (++writePtr == endPtr)
                    break;
            }
        }
        while (readPtr < endPtr) {
            QChar ch = *readPtr++;
            if (ch != CR) {
                *writePtr++ = ch;
            } else {
                if (n < readBufferOffset)
                    --readBufferOffset;
                --bytesRead;
            }
            ++n;
        }
        readBuffer.resize(writePtr - readBuffer.data());
    }

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::fillReadBuffer() read %d bytes from device. readBuffer = [%s]",
           int(bytesRead),
           QtDebugUtils::toPrintable(readBuffer.toLatin1(), readBuffer.size(),
                                     readBuffer.size()).constData());
#endif
    return true;
}